

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall EthBasePort::OptimizeFirewireGapCount(EthBasePort *this)

{
  undefined4 in_EAX;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  uint node;
  uint uVar5;
  uint uVar6;
  char cVar7;
  undefined4 uStack_38;
  quadlet_t data;
  uint uVar8;
  
  _uStack_38 = CONCAT44(1,in_EAX);
  uVar5 = 0;
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[5])(this,0x3f,1,1,0);
  if ((char)iVar1 != '\0') {
    uVar8 = 0x3f;
    uVar6 = 0;
    while( true ) {
      cVar7 = (char)uVar8;
      if ((this->super_BasePort).NumOfNodes_ <= uVar5) break;
      iVar1 = (*(this->super_BasePort)._vptr_BasePort[4])(this,(ulong)(uVar5 & 0xffff),2,&data);
      if ((char)iVar1 == '\0') {
        return false;
      }
      uVar4 = (uint)((byte)(_uStack_38 >> 0x20) & 0x3f);
      if ((data & 0x3f) < uVar8) {
        uVar8 = uVar4;
      }
      if (uVar6 < (data & 0x3f)) {
        uVar6 = uVar4;
      }
      uVar5 = uVar5 + 1;
    }
    if (cVar7 == (char)uVar6) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "OptimizeFirewireGapCount: current gap count is ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "OptimizeFirewireGapCount: inconsistent gap counts (");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,"-");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,")");
    }
    std::endl<char,std::char_traits<char>>(poVar2);
    if (cVar7 != '?' && cVar7 == (char)uVar6) {
      return true;
    }
    uVar3 = (ulong)(this->super_BasePort).NumOfNodes_;
    uVar5 = 0x3f;
    if (uVar3 < 0x19) {
      uVar5 = (uint)"?\x05\a\b\n\r\x10\x12\x15\x18\x1a\x1d #%(+.0369;>?"[uVar3];
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "OptimizeFirewireGapCount: updating gap count to ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    _uStack_38 = CONCAT44(uVar5,uStack_38) | 0x110000000000;
    iVar1 = (*(this->super_BasePort)._vptr_BasePort[5])(this,0x3f,1,(ulong)(uVar5 | 0x1100),0);
    if ((char)iVar1 != '\0') {
      return true;
    }
  }
  poVar2 = std::operator<<((this->super_BasePort).outStr,
                           "OptimizeFirewireGapCount: failed to broadcast PHY command");
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool EthBasePort::OptimizeFirewireGapCount()
{
    // Broadcast to all boards to initiate read of PHY register 1
    quadlet_t data = 1;
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data)) {
        outStr << "OptimizeFirewireGapCount: failed to broadcast PHY command" << std::endl;
        return false;
    }
    // Now, read each node to get the gap count
    unsigned char gap_count_min = gap_count_default;
    unsigned char gap_count_max = 0;
    for (unsigned int node = 0; node < NumOfNodes_; node++) {
        if (!ReadQuadletNode(node, BoardIO::FW_PHY_RESP, data))
            return false;
        unsigned char gap_count = static_cast<unsigned char>(data) & 0x3f;
        if (gap_count < gap_count_min)
            gap_count_min = gap_count;
        if (gap_count > gap_count_max)
            gap_count_max = gap_count;
    }
    if (gap_count_min == gap_count_max) {
        std::cout << "OptimizeFirewireGapCount: current gap count is "
                  << static_cast<unsigned int>(gap_count_min) << std::endl;
    }
    else if (gap_count_min != gap_count_max)
        std::cout << "OptimizeFirewireGapCount: inconsistent gap counts ("
                  << static_cast<unsigned int>(gap_count_min) << "-"
                  << static_cast<unsigned int>(gap_count_max) << ")" << std::endl;
    // Update the gap count if it is inconsistent, or if the gap count is the default value of 63,
    // which would indicate that it has not yet been set (e.g., there is PC connected via Firewire).
    if ((gap_count_min != gap_count_max) || (gap_count_min == gap_count_default)) {
        unsigned char gap_count_new = gap_count_default;
        if (NumOfNodes_ < 25)
            gap_count_new = gap_counts[NumOfNodes_];
        std::cout << "OptimizeFirewireGapCount: updating gap count to "
                  << static_cast<unsigned int>(gap_count_new) << std::endl;
        // Set bit 12 to indicate write; addr (1) in bits 11-8, data (gap_count) in bits 7-0
        data = 0x00001100 | static_cast<quadlet_t>(gap_count_new);
        if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data)) {
            outStr << "OptimizeFirewireGapCount: failed to broadcast PHY command" << std::endl;
            return false;
        }
    }
    return true;
}